

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O2

void png_read_filter_row_avg(png_row_infop row_info,png_bytep row,png_const_bytep prev_row)

{
  png_size_t pVar1;
  png_const_bytep pp;
  png_bytep rp;
  long lVar2;
  ulong uVar3;
  
  uVar3 = (ulong)(row_info->pixel_depth + 7 >> 3);
  pVar1 = row_info->rowbytes;
  for (lVar2 = 0; -lVar2 != uVar3; lVar2 = lVar2 + -1) {
    *row = *row + (*prev_row >> 1);
    prev_row = prev_row + 1;
    row = row + 1;
  }
  for (lVar2 = 0; pVar1 - uVar3 != lVar2; lVar2 = lVar2 + 1) {
    row[lVar2] = row[lVar2] + (char)((uint)row[lVar2 - uVar3] + (uint)prev_row[lVar2] >> 1);
  }
  return;
}

Assistant:

static void
png_read_filter_row_avg(png_row_infop row_info, png_bytep row,
    png_const_bytep prev_row)
{
   png_size_t i;
   png_bytep rp = row;
   png_const_bytep pp = prev_row;
   unsigned int bpp = (row_info->pixel_depth + 7) >> 3;
   png_size_t istop = row_info->rowbytes - bpp;

   for (i = 0; i < bpp; i++)
   {
      *rp = (png_byte)(((int)(*rp) +
         ((int)(*pp++) / 2 )) & 0xff);

      rp++;
   }

   for (i = 0; i < istop; i++)
   {
      *rp = (png_byte)(((int)(*rp) +
         (int)(*pp++ + *(rp-bpp)) / 2 ) & 0xff);

      rp++;
   }
}